

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cellml_1_0.cpp
# Opt level: O1

void __thiscall
ParserTransform_renameNonSiUnits_Test::~ParserTransform_renameNonSiUnits_Test
          (ParserTransform_renameNonSiUnits_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this,0x10);
  return;
}

Assistant:

TEST(ParserTransform, renameNonSiUnits)
{
    libcellml::ParserPtr parser = libcellml::Parser::create(false);
    auto model = parser->parseModel(fileContents("cellml1X/non_si_units.cellml"));

    EXPECT_EQ(size_t(11), model->unitsCount());
    EXPECT_EQ(size_t(2), model->componentCount());

    auto unitsMetre = model->units(0);
    auto unitsLitre = model->units(1);

    EXPECT_EQ("metre", unitsMetre->unitAttributeReference(0));
    EXPECT_EQ("litre", unitsLitre->unitAttributeReference(0));

    auto v1 = model->component(1)->variable(1);
    auto v2 = model->component(1)->variable(3);

    EXPECT_EQ("metre", v1->units()->name());
    EXPECT_EQ("litre", v2->units()->name());
}